

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

optional<long> __thiscall ArgsManager::GetIntArg(ArgsManager *this,string *strArg)

{
  long lVar1;
  _Storage<long,_true> _Var2;
  undefined8 extraout_RDX;
  string *in_RDI;
  long in_FS_OFFSET;
  optional<long> oVar3;
  SettingsValue value;
  UniValue *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  ArgsManager *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  GetSetting(in_stack_ffffffffffffff90,in_RDI);
  oVar3 = SettingToInt((SettingsValue *)
                       CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  _Var2._M_value =
       oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
       _M_payload;
  UniValue::~UniValue(in_stack_ffffffffffffff38);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._9_7_
         = (undefined7)((ulong)extraout_RDX >> 8);
    oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = _Var2._M_value;
    return (optional<long>)
           oVar3.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<int64_t> ArgsManager::GetIntArg(const std::string& strArg) const
{
    const common::SettingsValue value = GetSetting(strArg);
    return SettingToInt(value);
}